

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cc
# Opt level: O2

uintb __thiscall RangeList::longestFit(RangeList *this,Address *addr,uintb maxsize)

{
  AddrSpace *pAVar1;
  const_iterator cVar2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  uintb uVar6;
  key_type local_48;
  
  local_48.spc = addr->base;
  uVar6 = 0;
  if ((local_48.spc != (AddrSpace *)0x0) &&
     ((this->tree)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    p_Var5 = (_Base_ptr)addr->offset;
    local_48.first = (uintb)p_Var5;
    local_48.last = (uintb)p_Var5;
    cVar2 = std::
            _Rb_tree<Range,_Range,_std::_Identity<Range>,_std::less<Range>,_std::allocator<Range>_>
            ::upper_bound((_Rb_tree<Range,_Range,_std::_Identity<Range>,_std::less<Range>,_std::allocator<Range>_>
                           *)this,&local_48);
    if ((cVar2._M_node == (this->tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) ||
       (p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(cVar2._M_node),
       p_Var3[1]._M_left < p_Var5)) {
      uVar6 = 0;
    }
    else {
      pAVar1 = addr->base;
      uVar6 = 0;
      while ((*(AddrSpace **)(p_Var3 + 1) == pAVar1 && (p_Var3[1]._M_parent <= p_Var5))) {
        p_Var4 = (_Base_ptr)((long)&(p_Var3[1]._M_left)->_M_color + 1);
        uVar6 = (long)p_Var4 + (uVar6 - (long)p_Var5);
        if (maxsize <= uVar6) {
          return uVar6;
        }
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
        p_Var5 = p_Var4;
        if ((_Rb_tree_header *)p_Var3 == &(this->tree)._M_t._M_impl.super__Rb_tree_header) {
          return uVar6;
        }
      }
    }
  }
  return uVar6;
}

Assistant:

void Range::saveXml(ostream &s) const

{
  s << "<range";
  a_v(s,"space",spc->getName());
  a_v_u(s,"first",first);
  a_v_u(s,"last",last);
  s << "/>\n";
}